

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

int mbedtls_ssl_write_record(mbedtls_ssl_context *ssl,int force_flush)

{
  mbedtls_ssl_protocol_version mVar1;
  byte *pbVar2;
  mbedtls_ssl_config *pmVar3;
  bool bVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ushort uVar9;
  ushort uVar10;
  ulong uVar11;
  size_t sVar12;
  int iVar13;
  uchar *puVar14;
  uint unaff_R15D;
  uint uVar15;
  undefined1 local_68 [8];
  mbedtls_record rec;
  
  sVar12 = ssl->out_msglen;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0xb84,"=> write record");
  mVar1 = ssl->tls_version;
  uVar6 = (mVar1 == 0x302 | 0x200) - mVar1;
  uVar9 = (ushort)uVar6;
  uVar10 = (ushort)mVar1;
  if (ssl->conf->transport == '\x01') {
    uVar10 = uVar9;
  }
  *(ushort *)(ssl->out_hdr + 1) = uVar10 << 8 | uVar10 >> 8;
  *(undefined8 *)ssl->out_ctr = *(undefined8 *)ssl->cur_out_ctr;
  *(ushort *)ssl->out_len = (ushort)sVar12 << 8 | (ushort)sVar12 >> 8;
  rec.data_len._4_4_ = force_flush;
  uVar15 = unaff_R15D;
  if (ssl->transform_out != (mbedtls_ssl_transform *)0x0) {
    rec._8_8_ = ssl->out_iv;
    rec.buf = ssl->out_buf + (0x42d - rec._8_8_);
    rec.data_offset = ssl->out_msglen;
    rec.buf_len = (size_t)(ssl->out_msg + -rec._8_8_);
    local_68 = *(undefined1 (*) [8])ssl->out_ctr;
    uVar10 = (ushort)mVar1;
    if (ssl->conf->transport == '\x01') {
      uVar10 = uVar9;
    }
    rec.ctr._1_2_ = uVar10 << 8 | uVar10 >> 8;
    rec.ctr[0] = (uint8_t)ssl->out_msgtype;
    uVar6 = mbedtls_ssl_encrypt_buf
                      (ssl,ssl->transform_out,(mbedtls_record *)local_68,
                       (mbedtls_ssl_recv_t *)(ulong)uVar6,(void *)rec.buf_len);
    if (uVar6 == 0) {
      if (rec.buf_len == 0) {
        ssl->out_msgtype = (uint)rec.ctr[0];
        ssl->out_msglen = rec.data_offset;
        *(ushort *)ssl->out_len = (ushort)rec.data_offset << 8 | (ushort)rec.data_offset >> 8;
        bVar4 = true;
        sVar12 = rec.data_offset;
      }
      else {
        bVar4 = false;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xbb6,"should never happen");
        unaff_R15D = 0xffff9400;
      }
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0xbb1,"ssl_encrypt_buf",uVar6);
      bVar4 = false;
      unaff_R15D = uVar6;
    }
    uVar15 = unaff_R15D;
    if (!bVar4) {
      bVar4 = false;
      goto LAB_0020c219;
    }
  }
  puVar14 = ssl->out_iv + (sVar12 - (long)ssl->out_hdr);
  if (ssl->conf->transport == '\x01') {
    uVar11 = ssl->out_left;
    sVar5 = mbedtls_ssl_get_current_mtu(ssl);
    uVar8 = 0x42d;
    if (sVar5 - 1 < 0x42c) {
      uVar8 = sVar5;
    }
    unaff_R15D = (int)uVar8 - (int)uVar11;
    if (uVar8 < uVar11) {
      unaff_R15D = 0xffff9400;
    }
    if ((int)unaff_R15D < 0) {
      bVar4 = false;
      goto LAB_0020c219;
    }
    if ((uchar *)(ulong)unaff_R15D < puVar14) {
      bVar4 = false;
      unaff_R15D = 0xffff9400;
      goto LAB_0020c219;
    }
  }
  *ssl->out_hdr = (uchar)ssl->out_msgtype;
  pbVar2 = ssl->out_hdr;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0xbdb,"output record: msgtype = %u, version = [%u:%u], msglen = %zu",(ulong)*pbVar2,
             (ulong)pbVar2[1],(ulong)pbVar2[2],sVar12);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0xbde,"output record sent to network",ssl->out_hdr,(size_t)puVar14);
  ssl->out_left = (size_t)(puVar14 + ssl->out_left);
  ssl->out_hdr = ssl->out_hdr + (long)puVar14;
  mbedtls_ssl_update_out_pointers(ssl,ssl->transform_out);
  pmVar3 = ssl->conf;
  uVar6 = 7;
  do {
    uVar7 = uVar6 + 1;
    if (uVar7 <= (uint)(pmVar3->transport == '\x01') * 2) break;
    uVar11 = (ulong)uVar6;
    uVar6 = uVar6 - 1;
    puVar14 = ssl->cur_out_ctr + uVar11;
    *puVar14 = *puVar14 + '\x01';
  } while (*puVar14 == '\0');
  bVar4 = true;
  unaff_R15D = uVar15;
  if ((uint)(pmVar3->transport == '\x01') * 2 == uVar7) {
    bVar4 = false;
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0xbec,"outgoing message counter would wrap");
    unaff_R15D = 0xffff9480;
  }
LAB_0020c219:
  if (bVar4) {
    iVar13 = rec.data_len._4_4_;
    if ((rec.data_len._4_4_ == 0) && (ssl->conf->transport == '\x01')) {
      uVar6 = ssl_get_remaining_payload_in_datagram(ssl);
      if ((int)uVar6 < 0) {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xbf8,"ssl_get_remaining_payload_in_datagram",uVar6);
        iVar13 = 0;
        unaff_R15D = uVar6;
      }
      else if (uVar6 == 0) {
        iVar13 = 1;
      }
      else {
        iVar13 = 0;
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0xc02,"Still %u bytes available in current datagram",(ulong)uVar6);
      }
      if ((int)uVar6 < 0) {
        return unaff_R15D;
      }
    }
    if ((iVar13 == 1) && (unaff_R15D = mbedtls_ssl_flush_output(ssl), unaff_R15D != 0)) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0xc09,"mbedtls_ssl_flush_output",unaff_R15D);
    }
    else {
      unaff_R15D = 0;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0xc0d,"<= write record");
    }
  }
  return unaff_R15D;
}

Assistant:

int mbedtls_ssl_write_record(mbedtls_ssl_context *ssl, int force_flush)
{
    int ret, done = 0;
    size_t len = ssl->out_msglen;
    int flush = force_flush;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> write record"));

    if (!done) {
        unsigned i;
        size_t protected_record_size;
#if defined(MBEDTLS_SSL_VARIABLE_BUFFER_LENGTH)
        size_t out_buf_len = ssl->out_buf_len;
#else
        size_t out_buf_len = MBEDTLS_SSL_OUT_BUFFER_LEN;
#endif
        /* Skip writing the record content type to after the encryption,
         * as it may change when using the CID extension. */
        mbedtls_ssl_protocol_version tls_ver = ssl->tls_version;
#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
        /* TLS 1.3 still uses the TLS 1.2 version identifier
         * for backwards compatibility. */
        if (tls_ver == MBEDTLS_SSL_VERSION_TLS1_3) {
            tls_ver = MBEDTLS_SSL_VERSION_TLS1_2;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */
        mbedtls_ssl_write_version(ssl->out_hdr + 1, ssl->conf->transport,
                                  tls_ver);

        memcpy(ssl->out_ctr, ssl->cur_out_ctr, MBEDTLS_SSL_SEQUENCE_NUMBER_LEN);
        MBEDTLS_PUT_UINT16_BE(len, ssl->out_len, 0);

        if (ssl->transform_out != NULL) {
            mbedtls_record rec;

            rec.buf         = ssl->out_iv;
            rec.buf_len     = out_buf_len - (ssl->out_iv - ssl->out_buf);
            rec.data_len    = ssl->out_msglen;
            rec.data_offset = ssl->out_msg - rec.buf;

            memcpy(&rec.ctr[0], ssl->out_ctr, sizeof(rec.ctr));
            mbedtls_ssl_write_version(rec.ver, ssl->conf->transport, tls_ver);
            rec.type = ssl->out_msgtype;

#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
            /* The CID is set by mbedtls_ssl_encrypt_buf(). */
            rec.cid_len = 0;
#endif /* MBEDTLS_SSL_DTLS_CONNECTION_ID */

            if ((ret = mbedtls_ssl_encrypt_buf(ssl, ssl->transform_out, &rec,
                                               ssl->conf->f_rng, ssl->conf->p_rng)) != 0) {
                MBEDTLS_SSL_DEBUG_RET(1, "ssl_encrypt_buf", ret);
                return ret;
            }

            if (rec.data_offset != 0) {
                MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
                return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
            }

            /* Update the record content type and CID. */
            ssl->out_msgtype = rec.type;
#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
            memcpy(ssl->out_cid, rec.cid, rec.cid_len);
#endif /* MBEDTLS_SSL_DTLS_CONNECTION_ID */
            ssl->out_msglen = len = rec.data_len;
            MBEDTLS_PUT_UINT16_BE(rec.data_len, ssl->out_len, 0);
        }

        protected_record_size = len + mbedtls_ssl_out_hdr_len(ssl);

#if defined(MBEDTLS_SSL_PROTO_DTLS)
        /* In case of DTLS, double-check that we don't exceed
         * the remaining space in the datagram. */
        if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
            ret = ssl_get_remaining_space_in_datagram(ssl);
            if (ret < 0) {
                return ret;
            }

            if (protected_record_size > (size_t) ret) {
                /* Should never happen */
                return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
            }
        }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        /* Now write the potentially updated record content type. */
        ssl->out_hdr[0] = (unsigned char) ssl->out_msgtype;

        MBEDTLS_SSL_DEBUG_MSG(3, ("output record: msgtype = %u, "
                                  "version = [%u:%u], msglen = %" MBEDTLS_PRINTF_SIZET,
                                  ssl->out_hdr[0], ssl->out_hdr[1],
                                  ssl->out_hdr[2], len));

        MBEDTLS_SSL_DEBUG_BUF(4, "output record sent to network",
                              ssl->out_hdr, protected_record_size);

        ssl->out_left += protected_record_size;
        ssl->out_hdr  += protected_record_size;
        mbedtls_ssl_update_out_pointers(ssl, ssl->transform_out);

        for (i = 8; i > mbedtls_ssl_ep_len(ssl); i--) {
            if (++ssl->cur_out_ctr[i - 1] != 0) {
                break;
            }
        }

        /* The loop goes to its end if the counter is wrapping */
        if (i == mbedtls_ssl_ep_len(ssl)) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("outgoing message counter would wrap"));
            return MBEDTLS_ERR_SSL_COUNTER_WRAPPING;
        }
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        flush == SSL_DONT_FORCE_FLUSH) {
        size_t remaining;
        ret = ssl_get_remaining_payload_in_datagram(ssl);
        if (ret < 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "ssl_get_remaining_payload_in_datagram",
                                  ret);
            return ret;
        }

        remaining = (size_t) ret;
        if (remaining == 0) {
            flush = SSL_FORCE_FLUSH;
        } else {
            MBEDTLS_SSL_DEBUG_MSG(2,
                                  ("Still %u bytes available in current datagram",
                                   (unsigned) remaining));
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    if ((flush == SSL_FORCE_FLUSH) &&
        (ret = mbedtls_ssl_flush_output(ssl)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_flush_output", ret);
        return ret;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= write record"));

    return 0;
}